

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O3

size_t ZSTD_compressBlock_btlazy2_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  undefined8 *puVar1;
  uint uVar2;
  int iVar3;
  undefined8 uVar4;
  int *piVar5;
  seqStore_t *psVar6;
  U32 lowestValid_1;
  int iVar7;
  uint uVar8;
  U32 UVar9;
  size_t sVar10;
  ulong uVar11;
  ulong uVar12;
  BYTE *pBVar13;
  U32 UVar14;
  U32 UVar15;
  int *piVar16;
  int *mEnd;
  BYTE *pBVar17;
  BYTE *pBVar18;
  int *piVar19;
  long lVar20;
  ulong uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  int *piVar25;
  ulong uVar26;
  seqDef *psVar27;
  U32 UVar28;
  size_t ofbCandidate;
  U32 maxDistance;
  U32 local_d4;
  size_t local_d0;
  int *local_c8;
  ZSTD_matchState_t *local_c0;
  int local_b8;
  uint local_b4;
  BYTE *local_b0;
  ulong local_a8;
  uint local_9c;
  int *local_98;
  int *local_90;
  BYTE *local_88;
  BYTE *local_80;
  U32 local_74;
  seqStore_t *local_70;
  int *local_68;
  ulong local_60;
  int *local_58;
  uint local_4c;
  int *local_48;
  U32 *local_40;
  BYTE *local_38;
  
  local_c8 = (int *)((long)src + srcSize);
  local_90 = (int *)((long)src + (srcSize - 8));
  local_80 = (ms->window).base;
  local_b0 = (ms->window).dictBase;
  uVar22 = (ms->window).dictLimit;
  local_a8 = (ulong)uVar22;
  local_88 = local_80 + local_a8;
  uVar8 = (ms->window).lowLimit;
  uVar23 = (ms->cParams).windowLog;
  uVar2 = (ms->cParams).minMatch;
  uVar24 = 6;
  if (uVar2 < 6) {
    uVar24 = uVar2;
  }
  local_9c = 4;
  if (4 < uVar24) {
    local_9c = uVar24;
  }
  local_d4 = *rep;
  UVar28 = rep[1];
  ms->lazySkipping = 0;
  piVar25 = (int *)((ulong)(local_88 == (BYTE *)src) + (long)src);
  local_40 = rep;
  if (piVar25 < local_90) {
    local_68 = (int *)(local_b0 + local_a8);
    local_38 = local_b0 + uVar8;
    local_b4 = 1 << ((byte)uVar23 & 0x1f);
    local_b8 = uVar22 - 1;
    local_48 = local_c8 + -8;
    local_c0 = ms;
    local_70 = seqStore;
    do {
      uVar22 = (int)piVar25 - (int)local_80;
      uVar11 = (ulong)uVar22;
      iVar7 = uVar22 + 1;
      UVar15 = (local_c0->window).lowLimit;
      UVar14 = iVar7 - local_b4;
      if (iVar7 - UVar15 <= local_b4) {
        UVar14 = UVar15;
      }
      if (local_c0->loadedDictEnd != 0) {
        UVar14 = UVar15;
      }
      uVar8 = iVar7 - local_d4;
      pBVar17 = local_80;
      if (uVar8 < (uint)local_a8) {
        pBVar17 = local_b0;
      }
      local_58 = (int *)src;
      if (local_b8 - uVar8 < 3) {
LAB_001e436a:
        uVar21 = 0;
      }
      else {
        uVar21 = 0;
        if (local_d4 <= (uVar22 - UVar14) + 1) {
          if (*(int *)((long)piVar25 + 1) != *(int *)(pBVar17 + uVar8)) goto LAB_001e436a;
          piVar19 = local_c8;
          if (uVar8 < (uint)local_a8) {
            piVar19 = local_68;
          }
          sVar10 = ZSTD_count_2segments
                             ((BYTE *)((long)piVar25 + 5),(BYTE *)((long)(pBVar17 + uVar8) + 4),
                              (BYTE *)local_c8,(BYTE *)piVar19,local_88);
          uVar21 = sVar10 + 4;
        }
      }
      local_d0 = 999999999;
      local_60 = uVar11;
      if (local_9c == 6) {
        uVar11 = ZSTD_BtFindBestMatch_extDict_6(local_c0,(BYTE *)piVar25,(BYTE *)local_c8,&local_d0)
        ;
      }
      else if (local_9c == 5) {
        uVar11 = ZSTD_BtFindBestMatch_extDict_5(local_c0,(BYTE *)piVar25,(BYTE *)local_c8,&local_d0)
        ;
      }
      else {
        uVar11 = ZSTD_BtFindBestMatch_extDict_4(local_c0,(BYTE *)piVar25,(BYTE *)local_c8,&local_d0)
        ;
      }
      uVar12 = uVar21;
      if (uVar21 < uVar11) {
        uVar12 = uVar11;
      }
      if (uVar12 < 4) {
        local_c0->lazySkipping = (uint)(0x8ff < (ulong)((long)piVar25 - (long)local_58));
        src = local_58;
        piVar25 = (int *)((long)piVar25 + ((ulong)((long)piVar25 - (long)local_58) >> 8) + 1);
      }
      else {
        local_98 = piVar25;
        uVar26 = local_d0;
        if (uVar11 <= uVar21) {
          local_98 = (int *)((long)piVar25 + 1);
          uVar26 = 1;
        }
        uVar11 = uVar12;
        uVar21 = local_60;
        local_74 = UVar28;
        if (piVar25 < local_90) {
          do {
            piVar5 = local_c8;
            piVar19 = (int *)((long)piVar25 + 1);
            local_4c = (int)uVar21 + 1;
            if (uVar26 == 0) {
              uVar26 = 0;
            }
            else {
              UVar28 = (local_c0->window).lowLimit;
              UVar15 = local_4c - local_b4;
              if (local_4c - UVar28 <= local_b4) {
                UVar15 = UVar28;
              }
              if (local_c0->loadedDictEnd != 0) {
                UVar15 = UVar28;
              }
              uVar22 = local_4c - local_d4;
              pBVar17 = local_80;
              if (uVar22 < (uint)local_a8) {
                pBVar17 = local_b0;
              }
              if (((2 < local_b8 - uVar22) && (local_d4 <= local_4c - UVar15)) &&
                 (*piVar19 == *(int *)(pBVar17 + uVar22))) {
                piVar16 = local_c8;
                if (uVar22 < (uint)local_a8) {
                  piVar16 = local_68;
                }
                sVar10 = ZSTD_count_2segments
                                   ((BYTE *)((long)piVar25 + 5),
                                    (BYTE *)((long)(pBVar17 + uVar22) + 4),(BYTE *)local_c8,
                                    (BYTE *)piVar16,local_88);
                uVar22 = (uint)uVar26;
                if (uVar22 == 0) goto LAB_001e4bca;
                if (sVar10 < 0xfffffffffffffffc) {
                  uVar8 = 0x1f;
                  if (uVar22 != 0) {
                    for (; uVar22 >> uVar8 == 0; uVar8 = uVar8 - 1) {
                    }
                  }
                  if ((int)((uVar8 ^ 0x1f) + (int)uVar12 * 3 + -0x1e) < (int)(sVar10 + 4) * 3) {
                    uVar26 = 1;
                    uVar12 = sVar10 + 4;
                    local_98 = piVar19;
                  }
                }
              }
            }
            local_d0 = 999999999;
            local_60 = uVar12;
            if (local_9c == 6) {
              uVar12 = ZSTD_BtFindBestMatch_extDict_6
                                 (local_c0,(BYTE *)piVar19,(BYTE *)piVar5,&local_d0);
            }
            else if (local_9c == 5) {
              uVar12 = ZSTD_BtFindBestMatch_extDict_5
                                 (local_c0,(BYTE *)piVar19,(BYTE *)piVar5,&local_d0);
            }
            else {
              uVar12 = ZSTD_BtFindBestMatch_extDict_4
                                 (local_c0,(BYTE *)piVar19,(BYTE *)piVar5,&local_d0);
            }
            uVar11 = local_60;
            piVar16 = local_98;
            piVar5 = local_c8;
            uVar22 = (uint)local_d0;
            if ((uVar22 == 0) || (uVar8 = (uint)uVar26, uVar8 == 0)) goto LAB_001e4bca;
            iVar7 = (int)local_60;
            if (uVar12 < 4) {
LAB_001e4604:
              if (local_90 <= piVar19) break;
              uVar23 = (int)uVar21 + 2;
              UVar28 = (local_c0->window).lowLimit;
              UVar15 = uVar23 - local_b4;
              if (uVar23 - UVar28 <= local_b4) {
                UVar15 = UVar28;
              }
              if (local_c0->loadedDictEnd != 0) {
                UVar15 = UVar28;
              }
              uVar22 = uVar23 - local_d4;
              pBVar17 = local_80;
              if (uVar22 < (uint)local_a8) {
                pBVar17 = local_b0;
              }
              piVar19 = (int *)((long)piVar25 + 2);
              if (((2 < local_b8 - uVar22) && (local_d4 <= uVar23 - UVar15)) &&
                 (*piVar19 == *(int *)(pBVar17 + uVar22))) {
                mEnd = local_c8;
                if (uVar22 < (uint)local_a8) {
                  mEnd = local_68;
                }
                sVar10 = ZSTD_count_2segments
                                   ((BYTE *)((long)piVar25 + 6),
                                    (BYTE *)((long)(pBVar17 + uVar22) + 4),(BYTE *)local_c8,
                                    (BYTE *)mEnd,local_88);
                if (sVar10 < 0xfffffffffffffffc) {
                  uVar22 = 0x1f;
                  if (uVar8 != 0) {
                    for (; uVar8 >> uVar22 == 0; uVar22 = uVar22 - 1) {
                    }
                  }
                  if ((int)((uVar22 ^ 0x1f) + iVar7 * 4 + -0x1e) < (int)(sVar10 + 4) * 4) {
                    uVar26 = 1;
                    piVar16 = piVar19;
                    uVar11 = sVar10 + 4;
                  }
                }
              }
              local_d0 = 999999999;
              local_98 = piVar16;
              if (local_9c == 6) {
                uVar12 = ZSTD_BtFindBestMatch_extDict_6
                                   (local_c0,(BYTE *)piVar19,(BYTE *)piVar5,&local_d0);
              }
              else if (local_9c == 5) {
                uVar12 = ZSTD_BtFindBestMatch_extDict_5
                                   (local_c0,(BYTE *)piVar19,(BYTE *)piVar5,&local_d0);
              }
              else {
                uVar12 = ZSTD_BtFindBestMatch_extDict_4
                                   (local_c0,(BYTE *)piVar19,(BYTE *)piVar5,&local_d0);
              }
              uVar22 = (uint)local_d0;
              if ((uVar22 == 0) || (uVar8 = (uint)uVar26, uVar8 == 0)) {
LAB_001e4bca:
                __assert_fail("val != 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/bits.h"
                              ,0xab,"unsigned int ZSTD_highbit32(U32)");
              }
              if (uVar12 < 4) break;
              iVar7 = 0x1f;
              if (uVar22 != 0) {
                for (; uVar22 >> iVar7 == 0; iVar7 = iVar7 + -1) {
                }
              }
              uVar22 = 0x1f;
              if (uVar8 != 0) {
                for (; uVar8 >> uVar22 == 0; uVar22 = uVar22 - 1) {
                }
              }
              if ((int)uVar12 * 4 - iVar7 <= (int)((uVar22 ^ 0x1f) + (int)uVar11 * 4 + -0x18))
              break;
            }
            else {
              iVar3 = 0x1f;
              if (uVar22 != 0) {
                for (; uVar22 >> iVar3 == 0; iVar3 = iVar3 + -1) {
                }
              }
              uVar22 = 0x1f;
              if (uVar8 != 0) {
                for (; uVar8 >> uVar22 == 0; uVar22 = uVar22 - 1) {
                }
              }
              uVar23 = local_4c;
              if ((int)uVar12 * 4 - iVar3 <= (int)((uVar22 ^ 0x1f) + iVar7 * 4 + -0x1b))
              goto LAB_001e4604;
            }
            piVar25 = piVar19;
            uVar21 = (ulong)uVar23;
            uVar11 = uVar12;
            uVar26 = local_d0;
            local_98 = piVar25;
          } while (piVar25 < local_90);
        }
        piVar25 = local_98;
        uVar22 = local_d4;
        if (3 < uVar26) {
          pBVar18 = (BYTE *)((long)local_98 + (3 - (long)(local_80 + uVar26)));
          pBVar13 = local_88;
          pBVar17 = local_80;
          if ((uint)pBVar18 < (uint)local_a8) {
            pBVar13 = local_38;
            pBVar17 = local_b0;
          }
          if ((local_58 < local_98) &&
             (uVar21 = (ulong)pBVar18 & 0xffffffff, pBVar13 < pBVar17 + uVar21)) {
            pBVar17 = pBVar17 + uVar21;
            do {
              piVar19 = (int *)((long)piVar25 + -1);
              pBVar17 = pBVar17 + -1;
              if ((*(BYTE *)piVar19 != *pBVar17) ||
                 (uVar11 = uVar11 + 1, piVar25 = piVar19, piVar19 <= local_58)) break;
            } while (pBVar13 < pBVar17);
          }
          uVar22 = (U32)uVar26 - 3;
          local_74 = local_d4;
        }
        local_d4 = uVar22;
        if (local_70->maxNbSeq <=
            (ulong)((long)local_70->sequences - (long)local_70->sequencesStart >> 3)) {
LAB_001e4c08:
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x29d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < local_70->maxNbLit) {
LAB_001e4be9:
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x29f,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar21 = (long)piVar25 - (long)local_58;
        pBVar17 = local_70->lit;
        if (local_70->litStart + local_70->maxNbLit < pBVar17 + uVar21) {
LAB_001e4c27:
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2a0,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_c8 < piVar25) {
LAB_001e4c46:
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2a1,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_48 < piVar25) {
          ZSTD_safecopyLiterals(pBVar17,(BYTE *)local_58,(BYTE *)piVar25,(BYTE *)local_48);
LAB_001e48a5:
          local_70->lit = local_70->lit + uVar21;
          if (0xffff < uVar21) {
            if (local_70->longLengthType != ZSTD_llt_none) {
              __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                            ,0x2b2,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            local_70->longLengthType = ZSTD_llt_literalLength;
            local_70->longLengthPos =
                 (U32)((ulong)((long)local_70->sequences - (long)local_70->sequencesStart) >> 3);
          }
        }
        else {
          uVar4 = *(undefined8 *)(local_58 + 2);
          *(undefined8 *)pBVar17 = *(undefined8 *)local_58;
          *(undefined8 *)(pBVar17 + 8) = uVar4;
          pBVar17 = local_70->lit;
          if (0x10 < uVar21) {
            if ((BYTE *)0xffffffffffffffe0 < pBVar17 + 0x10 + (-0x10 - (long)(local_58 + 4))) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                            ,0xe9,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar4 = *(undefined8 *)(local_58 + 6);
            *(undefined8 *)(pBVar17 + 0x10) = *(undefined8 *)(local_58 + 4);
            *(undefined8 *)(pBVar17 + 0x18) = uVar4;
            if (0x20 < (long)uVar21) {
              lVar20 = 0;
              do {
                puVar1 = (undefined8 *)((long)local_58 + lVar20 + 0x20);
                uVar4 = puVar1[1];
                pBVar13 = pBVar17 + lVar20 + 0x20;
                *(undefined8 *)pBVar13 = *puVar1;
                *(undefined8 *)(pBVar13 + 8) = uVar4;
                puVar1 = (undefined8 *)((long)local_58 + lVar20 + 0x30);
                uVar4 = puVar1[1];
                *(undefined8 *)(pBVar13 + 0x10) = *puVar1;
                *(undefined8 *)(pBVar13 + 0x18) = uVar4;
                lVar20 = lVar20 + 0x20;
              } while (pBVar13 + 0x20 < pBVar17 + uVar21);
            }
            goto LAB_001e48a5;
          }
          local_70->lit = pBVar17 + uVar21;
        }
        psVar6 = local_70;
        psVar27 = local_70->sequences;
        psVar27->litLength = (U16)uVar21;
        psVar27->offBase = (U32)uVar26;
        if (uVar11 < 3) {
LAB_001e4c65:
          __assert_fail("matchLength >= MINMATCH",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,700,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0xffff < uVar11 - 3) {
          if (local_70->longLengthType != ZSTD_llt_none) {
LAB_001e4c84:
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2bf,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          local_70->longLengthType = ZSTD_llt_matchLength;
          local_70->longLengthPos =
               (U32)((ulong)((long)psVar27 - (long)local_70->sequencesStart) >> 3);
        }
        psVar27->mlBase = (U16)(uVar11 - 3);
        psVar27 = psVar27 + 1;
        local_70->sequences = psVar27;
        if (local_c0->lazySkipping != 0) {
          local_c0->lazySkipping = 0;
        }
        src = (void *)((long)piVar25 + uVar11);
        piVar25 = (int *)src;
        UVar28 = local_74;
        UVar15 = local_74;
        if (src <= local_90) {
          do {
            UVar9 = local_d4;
            iVar7 = (int)src - (int)local_80;
            UVar28 = (local_c0->window).lowLimit;
            UVar14 = iVar7 - local_b4;
            if (iVar7 - UVar28 <= local_b4) {
              UVar14 = UVar28;
            }
            if (local_c0->loadedDictEnd != 0) {
              UVar14 = UVar28;
            }
            uVar22 = iVar7 - UVar15;
            pBVar17 = local_80;
            if (uVar22 < (uint)local_a8) {
              pBVar17 = local_b0;
            }
            piVar25 = (int *)src;
            UVar28 = UVar15;
            local_d4 = UVar9;
            if (((local_b8 - uVar22 < 3) || (iVar7 - UVar14 < UVar15)) ||
               (*src != *(int *)(pBVar17 + uVar22))) break;
            piVar25 = local_c8;
            if (uVar22 < (uint)local_a8) {
              piVar25 = local_68;
            }
            sVar10 = ZSTD_count_2segments
                               ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar17 + uVar22) + 4),
                                (BYTE *)local_c8,(BYTE *)piVar25,local_88);
            if (psVar6->maxNbSeq <= (ulong)((long)psVar27 - (long)psVar6->sequencesStart >> 3))
            goto LAB_001e4c08;
            if (0x20000 < psVar6->maxNbLit) goto LAB_001e4be9;
            pBVar17 = psVar6->lit;
            if (psVar6->litStart + psVar6->maxNbLit < pBVar17) goto LAB_001e4c27;
            if (local_c8 < src) goto LAB_001e4c46;
            if (local_48 < src) {
              ZSTD_safecopyLiterals(pBVar17,(BYTE *)src,(BYTE *)src,(BYTE *)local_48);
            }
            else {
              uVar4 = *(undefined8 *)((long)src + 8);
              *(undefined8 *)pBVar17 = *src;
              *(undefined8 *)(pBVar17 + 8) = uVar4;
            }
            psVar27 = psVar6->sequences;
            psVar27->litLength = 0;
            psVar27->offBase = 1;
            if (sVar10 + 4 < 3) goto LAB_001e4c65;
            if (0xffff < sVar10 + 1) {
              if (psVar6->longLengthType != ZSTD_llt_none) goto LAB_001e4c84;
              psVar6->longLengthType = ZSTD_llt_matchLength;
              psVar6->longLengthPos =
                   (U32)((ulong)((long)psVar27 - (long)psVar6->sequencesStart) >> 3);
            }
            psVar27->mlBase = (U16)(sVar10 + 1);
            psVar27 = psVar27 + 1;
            psVar6->sequences = psVar27;
            src = (void *)((long)src + sVar10 + 4);
            piVar25 = (int *)src;
            UVar28 = UVar9;
            local_d4 = UVar15;
            UVar15 = UVar9;
          } while (src <= local_90);
        }
      }
    } while (piVar25 < local_90);
  }
  *local_40 = local_d4;
  local_40[1] = UVar28;
  return (long)local_c8 - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_btlazy2_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)

{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, search_binaryTree, 2);
}